

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall slang::parsing::Parser::isPlainPortName(Parser *this)

{
  bool bVar1;
  ParserBase *in_RDI;
  Token TVar2;
  TokenKind kind;
  uint32_t index;
  uint32_t in_stack_ffffffffffffffb4;
  TokenKind local_40;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  
  while (TVar2 = ParserBase::peek(in_RDI,in_stack_ffffffffffffffb4), TVar2.kind == OpenBracket) {
    bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInPortReference>
                      (TVar2._0_8_,
                       (uint32_t *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                       local_40._14_2_,local_40._12_2_);
    if (!bVar1) {
      return true;
    }
  }
  TVar2 = ParserBase::peek(in_RDI,in_stack_ffffffffffffffb4);
  local_40 = TVar2.kind;
  if (((1 < (ushort)(local_40 - CloseParenthesis)) && (local_40 != Comma)) && (local_40 != Equals))
  {
    return false;
  }
  return true;
}

Assistant:

bool Parser::isPlainPortName() {
    uint32_t index = 1;
    while (peek(index).kind == TokenKind::OpenBracket) {
        index++;
        if (!scanTypePart<isNotInPortReference>(index, TokenKind::OpenBracket,
                                                TokenKind::CloseBracket)) {
            return true; // if we see nonsense, we'll recover by pretending this is a plain port
        }
    }

    auto kind = peek(index).kind;
    switch (kind) {
        case TokenKind::Equals:
        case TokenKind::Comma:
        case TokenKind::CloseParenthesis:
        case TokenKind::Semicolon:
            return true;
        default:
            return false;
    }
}